

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall InitSocket::IpChangeThread(InitSocket *this)

{
  int __fd;
  int iVar1;
  uint uVar2;
  void *__buf;
  size_t __n;
  ssize_t sVar3;
  bool bVar4;
  InitSocket *local_200;
  code *local_1f8;
  undefined8 local_1f0;
  type local_1e8;
  function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
  local_1d0;
  undefined1 local_1b0 [8];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  vNewIPAddr;
  nlmsghdr *nlh;
  int32_t transferred;
  allocator<char> local_179;
  string local_178 [8];
  string buf;
  socklen_t iLen;
  int iError;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_130 [4];
  uint __i;
  timeval timeout;
  fd_set errorfd;
  fd_set readfd;
  sockaddr_nl addr;
  int32_t fSock;
  InitSocket *this_local;
  
  __fd = socket(0x10,3,0);
  if (__fd != -1) {
    memset(readfd.fds_bits + 0xf,0,0xc);
    readfd.fds_bits[0xf]._0_2_ = 0x10;
    iVar1 = bind(__fd,(sockaddr *)(readfd.fds_bits + 0xf),0xc);
    if (iVar1 == -1) {
      close(__fd);
    }
    else {
      iVar1 = fcntl(__fd,2,1);
      if (iVar1 != -1) {
        uVar2 = fcntl(__fd,3);
        iVar1 = fcntl(__fd,4,(ulong)(uVar2 | 0x800));
        if (iVar1 != -1) {
          do {
            do {
              if ((this->m_bStopThread & 1U) != 0) {
LAB_0012cd1f:
                close(__fd);
                return;
              }
              _auStack_130 = 2;
              timeout.tv_sec = 0;
              for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                errorfd.fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
              }
              for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                errorfd.fds_bits[(ulong)__arr_1._4_4_ - 1] = 0;
              }
              errorfd.fds_bits[(long)(__fd / 0x40) + 0xf] =
                   1L << ((byte)((long)__fd % 0x40) & 0x3f) |
                   errorfd.fds_bits[(long)(__fd / 0x40) + 0xf];
              errorfd.fds_bits[(long)(__fd / 0x40) + -1] =
                   1L << ((byte)((long)__fd % 0x40) & 0x3f) |
                   errorfd.fds_bits[(long)(__fd / 0x40) + -1];
              iVar1 = select(__fd + 1,(fd_set *)(errorfd.fds_bits + 0xf),(fd_set *)0x0,
                             (fd_set *)&timeout.tv_usec,(timeval *)auStack_130);
            } while (iVar1 < 1);
            if ((errorfd.fds_bits[(long)(__fd / 0x40) + -1] &
                1L << ((byte)((long)__fd % 0x40) & 0x3f)) != 0) {
              buf.field_2._8_4_ = 4;
              getsockopt(__fd,1,4,(void *)((long)&buf.field_2 + 0xc),
                         (socklen_t *)(buf.field_2._M_local_buf + 8));
              goto LAB_0012cd1f;
            }
            if ((errorfd.fds_bits[(long)(__fd / 0x40) + 0xf] &
                1L << ((byte)((long)__fd % 0x40) & 0x3f)) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(local_178,0x1000,'\0',&local_179);
              std::allocator<char>::~allocator(&local_179);
              __buf = (void *)std::__cxx11::string::operator[]((ulong)local_178);
              __n = std::__cxx11::string::size();
              sVar3 = recv(__fd,__buf,__n,0);
              nlh._0_4_ = (uint)sVar3;
              if (0 < (int)(uint)nlh) {
                vNewIPAddr.
                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)std::__cxx11::string::operator[]((ulong)local_178);
                while( true ) {
                  bVar4 = false;
                  if (((0xf < (uint)nlh) &&
                      (bVar4 = false,
                      0xf < (uint)((vNewIPAddr.
                                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                  ).super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                                  super__Head_base<2UL,_int,_false>._M_head_impl)) &&
                     (bVar4 = false,
                     (uint)((vNewIPAddr.
                             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           ).super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                           super__Head_base<2UL,_int,_false>._M_head_impl <= (uint)nlh)) {
                    bVar4 = (short)((vNewIPAddr.
                                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                   ).super__Tuple_impl<1UL,_int,_int>.
                                   super__Head_base<1UL,_int,_false>._M_head_impl != 3;
                  }
                  if (!bVar4) break;
                  if ((((short)((vNewIPAddr.
                                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                               ).super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                               _M_head_impl == 0x14) ||
                      ((short)((vNewIPAddr.
                                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                              ).super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                              _M_head_impl == 0x15)) ||
                     ((short)((vNewIPAddr.
                               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                             ).super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>.
                             _M_head_impl == 0x16)) {
                    std::
                    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                              *)local_1b0);
                    local_1f8 = CbEnumIpAdressen;
                    local_1f0 = 0;
                    local_200 = this;
                    std::
                    bind<int(InitSocket::*)(int,std::__cxx11::string_const&,int,void*),InitSocket*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&>
                              (&local_1e8,(offset_in_InitSocket_to_subr *)&local_1f8,&local_200,
                               (_Placeholder<1> *)&std::placeholders::_1,
                               (_Placeholder<2> *)&std::placeholders::_2,
                               (_Placeholder<3> *)&std::placeholders::_3,
                               (_Placeholder<4> *)&std::placeholders::_4);
                    std::function<int(int,std::__cxx11::string_const&,int,void*)>::
                    function<std::_Bind<int(InitSocket::*(InitSocket*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>))(int,std::__cxx11::string_const&,int,void*)>,void>
                              ((function<int(int,std::__cxx11::string_const&,int,void*)> *)
                               &local_1d0,&local_1e8);
                    BaseSocketImpl::EnumIpAddresses(&local_1d0,local_1b0);
                    std::
                    function<int_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_void_*)>
                    ::~function(&local_1d0);
                    NotifyOnAddressChanges
                              (this,(vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                     *)local_1b0);
                    std::
                    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                               *)local_1b0);
                  }
                  nlh._0_4_ = (uint)nlh -
                              (((vNewIPAddr.
                                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                               ).super__Tuple_impl<1UL,_int,_int>.super__Tuple_impl<2UL,_int>.
                               super__Head_base<2UL,_int,_false>._M_head_impl + 3U & 0xfffffffc);
                  vNewIPAddr.
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((long)&((vNewIPAddr.
                                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                        ).super__Tuple_impl<1UL,_int,_int>.
                                        super__Tuple_impl<2UL,_int>.
                                        super__Head_base<2UL,_int,_false>._M_head_impl +
                                (ulong)(((vNewIPAddr.
                                          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                                        ).super__Tuple_impl<1UL,_int,_int>.
                                        super__Tuple_impl<2UL,_int>.
                                        super__Head_base<2UL,_int,_false>._M_head_impl + 3U &
                                       0xfffffffc));
                }
              }
              std::__cxx11::string::~string(local_178);
            }
          } while( true );
        }
      }
      close(__fd);
    }
  }
  return;
}

Assistant:

void InitSocket::IpChangeThread()
{
    SOCKET fSock;
    if ((fSock = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE)) == -1)
    {
        return;
    }

    struct sockaddr_nl addr{};
    addr.nl_family = AF_NETLINK;
    addr.nl_groups = RTMGRP_LINK | RTMGRP_IPV4_IFADDR | RTMGRP_IPV6_IFADDR;

    if (bind(fSock, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr)) == -1)
    {
        ::closesocket(fSock);
        return;
    }

    if (fcntl(fSock, F_SETFD, FD_CLOEXEC) == -1 || fcntl(fSock, F_SETFL, fcntl(fSock, F_GETFL) | O_NONBLOCK) == -1)
    {
        ::closesocket(fSock);
        return;
    }

    while (m_bStopThread == false)
    {
        fd_set readfd, errorfd;
        struct timeval timeout;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(fSock, &readfd);
        FD_SET(fSock, &errorfd);

        if (::select(static_cast<int>(fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(fSock, &errorfd))
            {
                int iError;
                socklen_t iLen = sizeof(iError);
                getsockopt(fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&iError), &iLen);
                break;
            }

            if (FD_ISSET(fSock, &readfd))
            {
                string buf(4096, 0);
                int32_t transferred = ::recv(fSock, &buf[0], buf.size(), 0);

                if (transferred > 0)
                {
                    struct nlmsghdr* nlh = reinterpret_cast<struct nlmsghdr*>(&buf[0]);
                    while ((NLMSG_OK(nlh, static_cast<unsigned int>(transferred))) && (nlh->nlmsg_type != NLMSG_DONE))
                    {
                        if (nlh->nlmsg_type == RTM_NEWADDR || nlh->nlmsg_type == RTM_DELADDR || nlh->nlmsg_type == RTM_GETADDR)
                        {
                            /*struct ifaddrmsg *ifa = (struct ifaddrmsg *) NLMSG_DATA(nlh);
                            struct rtattr *rth = IFA_RTA(ifa);
                            int rtl = IFA_PAYLOAD(nlh);

                            char name[IFNAMSIZ];
                            if_indextoname(ifa->ifa_index, name);
                            */
                            vector<tuple<string, int, int>> vNewIPAddr;
                            BaseSocketImpl::EnumIpAddresses(bind(&InitSocket::CbEnumIpAdressen, this, placeholders::_1, placeholders::_2, placeholders::_3, placeholders::_4), &vNewIPAddr);
                            NotifyOnAddressChanges(vNewIPAddr);
                        }
                        nlh = NLMSG_NEXT(nlh, transferred);
                    }
                }
            }
        }
    }

    ::closesocket(fSock);
}